

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int test_count;
  int test_suite_count;
  string local_98;
  string local_78;
  int32_t local_58;
  int32_t shard_index;
  char *local_48;
  char *filter;
  string f;
  int iteration_local;
  UnitTest *unit_test_local;
  PrettyUnitTestResultPrinter *this_local;
  
  f.field_2._12_4_ = iteration;
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(iteration + 1));
  }
  std::__cxx11::string::string
            ((string *)&filter,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             FLAGS_gtest_filter_abi_cxx11_);
  local_48 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filter
                       );
  bVar1 = String::CStringEquals(local_48,"*");
  if (!bVar1) {
    ColoredPrintf(kYellow,"Note: %s filter = %s\n","Google Test",local_48);
  }
  bVar1 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",false);
  if (bVar1) {
    local_58 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
    uVar2 = local_58 + 1;
    pcVar3 = posix::GetEnv("GTEST_TOTAL_SHARDS");
    ColoredPrintf(kYellow,"Note: This is test shard %d of %s.\n",(ulong)uVar2,pcVar3);
  }
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    uVar2 = UnitTest::random_seed(unit_test);
    ColoredPrintf(kYellow,"Note: Randomizing tests\' orders with a seed of %d .\n",(ulong)uVar2);
  }
  ColoredPrintf(kGreen,"[==========] ");
  uVar2 = UnitTest::test_to_run_count(unit_test);
  FormatTestCount_abi_cxx11_(&local_78,(testing *)(ulong)uVar2,test_count);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_78);
  uVar2 = UnitTest::test_suite_to_run_count(unit_test);
  FormatTestSuiteCount_abi_cxx11_(&local_98,(testing *)(ulong)uVar2,test_suite_count);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_98);
  printf("Running %s from %s.\n",pcVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  fflush(_stdout);
  std::__cxx11::string::~string((string *)&filter);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG_GET(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  std::string f = GTEST_FLAG_GET(filter);
  const char* const filter = f.c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(GTestColor::kYellow, "Note: %s filter = %s\n", GTEST_NAME_,
                  filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const int32_t shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(GTestColor::kYellow, "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG_GET(shuffle)) {
    ColoredPrintf(GTestColor::kYellow,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  fflush(stdout);
}